

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_comparison_suite.cpp
# Opt level: O0

void equality_suite::compare_boolean_equal_real_literal(void)

{
  undefined1 local_359;
  longdouble local_358;
  basic_variable<std::allocator<char>_> local_348;
  undefined1 local_30b [2];
  undefined1 local_309;
  longdouble local_308;
  basic_variable<std::allocator<char>_> local_2f8;
  undefined1 local_2bb [2];
  undefined1 local_2b9;
  longdouble local_2b8;
  basic_variable<std::allocator<char>_> local_2a8;
  undefined1 local_26b [2];
  undefined1 local_269;
  longdouble local_268;
  basic_variable<std::allocator<char>_> local_258;
  undefined1 local_223 [2];
  undefined1 local_221;
  double local_220;
  basic_variable<std::allocator<char>_> local_218;
  undefined1 local_1e3 [2];
  undefined1 local_1e1;
  double local_1e0;
  basic_variable<std::allocator<char>_> local_1d8;
  undefined1 local_1a3 [2];
  undefined1 local_1a1;
  double local_1a0;
  basic_variable<std::allocator<char>_> local_198;
  undefined1 local_163 [2];
  undefined1 local_161;
  double local_160;
  basic_variable<std::allocator<char>_> local_158;
  undefined1 local_11f [2];
  undefined1 local_11d;
  float local_11c;
  basic_variable<std::allocator<char>_> local_118;
  undefined1 local_df [2];
  undefined1 local_dd;
  float local_dc;
  basic_variable<std::allocator<char>_> local_d8;
  undefined1 local_9f [2];
  undefined1 local_9d;
  float local_9c;
  basic_variable<std::allocator<char>_> local_98;
  undefined1 local_5e [17];
  undefined1 local_4d;
  float local_4c;
  basic_variable<std::allocator<char>_> local_48;
  undefined1 local_a [2];
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_48,false);
  local_4c = 0.0;
  local_a[0] = trial::dynamic::operator==(&local_48,&local_4c);
  local_4d = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(false) == 0.0f","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x132,"void equality_suite::compare_boolean_equal_real_literal()",local_a,&local_4d);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_48);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_98,false);
  local_9c = 0.0;
  local_5e[0] = trial::dynamic::operator!=(&local_98,&local_9c);
  local_9d = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(false) != 0.0f","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x133,"void equality_suite::compare_boolean_equal_real_literal()",local_5e,&local_9d);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_98);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_d8,true);
  local_dc = 0.0;
  local_9f[0] = trial::dynamic::operator==(&local_d8,&local_dc);
  local_dd = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(true) == 0.0f","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x134,"void equality_suite::compare_boolean_equal_real_literal()",local_9f,&local_dd);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_118,true);
  local_11c = 0.0;
  local_df[0] = trial::dynamic::operator!=(&local_118,&local_11c);
  local_11d = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(true) != 0.0f","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x135,"void equality_suite::compare_boolean_equal_real_literal()",local_df,&local_11d)
  ;
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_118);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_158,false);
  local_160 = 0.0;
  local_11f[0] = trial::dynamic::operator==(&local_158,&local_160);
  local_161 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(false) == 0.0","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x137,"void equality_suite::compare_boolean_equal_real_literal()",local_11f,&local_161
            );
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_158);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_198,false);
  local_1a0 = 0.0;
  local_163[0] = trial::dynamic::operator!=(&local_198,&local_1a0);
  local_1a1 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(false) != 0.0","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x138,"void equality_suite::compare_boolean_equal_real_literal()",local_163,&local_1a1
            );
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_198);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_1d8,true);
  local_1e0 = 0.0;
  local_1a3[0] = trial::dynamic::operator==(&local_1d8,&local_1e0);
  local_1e1 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(true) == 0.0","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x139,"void equality_suite::compare_boolean_equal_real_literal()",local_1a3,&local_1e1
            );
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_1d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_218,true);
  local_220 = 0.0;
  local_1e3[0] = trial::dynamic::operator!=(&local_218,&local_220);
  local_221 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(true) != 0.0","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x13a,"void equality_suite::compare_boolean_equal_real_literal()",local_1e3,&local_221
            );
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_218);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_258,false);
  local_268 = (longdouble)0;
  local_223[0] = trial::dynamic::operator==(&local_258,&local_268);
  local_269 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(false) == 0.0L","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x13c,"void equality_suite::compare_boolean_equal_real_literal()",local_223,&local_269
            );
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_258);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_2a8,false);
  local_2b8 = (longdouble)0;
  local_26b[0] = trial::dynamic::operator!=(&local_2a8,&local_2b8);
  local_2b9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(false) != 0.0L","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x13d,"void equality_suite::compare_boolean_equal_real_literal()",local_26b,&local_2b9
            );
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_2a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_2f8,true);
  local_308 = (longdouble)0;
  local_2bb[0] = trial::dynamic::operator==(&local_2f8,&local_308);
  local_309 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(true) == 0.0L","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x13e,"void equality_suite::compare_boolean_equal_real_literal()",local_2bb,&local_309
            );
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_2f8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_348,true);
  local_358 = (longdouble)0;
  local_30b[0] = trial::dynamic::operator!=(&local_348,&local_358);
  local_359 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(true) != 0.0L","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x13f,"void equality_suite::compare_boolean_equal_real_literal()",local_30b,&local_359
            );
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_348);
  return;
}

Assistant:

void compare_boolean_equal_real_literal()
{
    TRIAL_PROTOCOL_TEST_EQUAL(variable(false) == 0.0f, true);
    TRIAL_PROTOCOL_TEST_EQUAL(variable(false) != 0.0f, false);
    TRIAL_PROTOCOL_TEST_EQUAL(variable(true) == 0.0f, false);
    TRIAL_PROTOCOL_TEST_EQUAL(variable(true) != 0.0f, true);

    TRIAL_PROTOCOL_TEST_EQUAL(variable(false) == 0.0, true);
    TRIAL_PROTOCOL_TEST_EQUAL(variable(false) != 0.0, false);
    TRIAL_PROTOCOL_TEST_EQUAL(variable(true) == 0.0, false);
    TRIAL_PROTOCOL_TEST_EQUAL(variable(true) != 0.0, true);

    TRIAL_PROTOCOL_TEST_EQUAL(variable(false) == 0.0L, true);
    TRIAL_PROTOCOL_TEST_EQUAL(variable(false) != 0.0L, false);
    TRIAL_PROTOCOL_TEST_EQUAL(variable(true) == 0.0L, false);
    TRIAL_PROTOCOL_TEST_EQUAL(variable(true) != 0.0L, true);
}